

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydbalance.cpp
# Opt level: O2

void findNodeOutflows(double lamda,double *dH,double *xQ,Network *nw)

{
  pointer ppNVar1;
  uint uVar2;
  int iVar3;
  pointer ppNVar4;
  ulong uVar5;
  Node *pNVar6;
  ulong uVar7;
  double dVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double extraout_XMM0_Qa_00;
  double dVar10;
  double local_38;
  double dqdh;
  
  ppNVar1 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar4 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar4 != ppNVar1; ppNVar4 = ppNVar4 + 1) {
    pNVar6 = *ppNVar4;
    pNVar6->outflow = 0.0;
    pNVar6->qGrad = 0.0;
  }
  if (nw->leakageModel != (LeakageModel *)0x0) {
    findLeakageFlows(lamda,dH,xQ,nw);
  }
  uVar7 = 0;
  uVar2 = Network::count(nw,NODE);
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar7;
  }
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    pNVar6 = Network::node(nw,(int)uVar7);
    dVar8 = dH[uVar7] * lamda + pNVar6->head;
    local_38 = 0.0;
    iVar3 = (*(pNVar6->super_Element)._vptr_Element[2])(pNVar6);
    if (iVar3 == 0) {
      (*(pNVar6->super_Element)._vptr_Element[7])(dVar8,pNVar6,&local_38);
      pNVar6->qGrad = local_38 + pNVar6->qGrad;
      pNVar6->outflow = pNVar6->outflow + extraout_XMM0_Qa;
      dVar9 = xQ[uVar7] - extraout_XMM0_Qa;
      xQ[uVar7] = dVar9;
      dVar10 = dVar9;
      if (pNVar6->fixedGrade != true) {
        (*(pNVar6->super_Element)._vptr_Element[6])(dVar8,pNVar6,nw,&local_38);
        pNVar6->qGrad = local_38 + pNVar6->qGrad;
        dVar9 = extraout_XMM0_Qa_00;
        dVar10 = xQ[uVar7];
      }
      xQ[uVar7] = dVar10 - dVar9;
      pNVar6->actualDemand = dVar9;
      pNVar6->outflow = dVar9 + pNVar6->outflow;
    }
    else {
      pNVar6->outflow = xQ[uVar7];
      xQ[uVar7] = 0.0;
    }
  }
  return;
}

Assistant:

void findNodeOutflows(double lamda, double dH[], double xQ[], Network* nw)
{
    // ... initialize node outflows and their gradients w.r.t. head

    for (Node* node : nw->nodes)
    {
        node->outflow = 0.0;
        node->qGrad = 0.0;
    }

    // ... find pipe leakage flows & assign them to node outflows

    if ( nw->leakageModel ) findLeakageFlows(lamda, dH, xQ, nw);

    // ... add emitter flows and demands to node outflows

    int nodeCount = nw->count(Element::NODE);
    for (int i = 0; i < nodeCount; i++)
    {
        Node* node = nw->node(i);
        double h = node->head + lamda * dH[i];
        double q = 0.0;
        double dqdh = 0.0;

        // ... for junctions, outflow depends on head

        if ( node->type() == Node::JUNCTION )
        {
            // ... contribution from emitter flow

            q = node->findEmitterFlow(h, dqdh);
            node->qGrad += dqdh;
            node->outflow += q;
            xQ[i] -= q;

            // ... contribution from demand flow

            // ... for fixed grade junction, demand is remaining flow excess
            if ( node->fixedGrade )
            {
                q = xQ[i];
                xQ[i] -= q;
            }

            // ... otherwise junction has pressure-dependent demand
            else
            {
                q = node->findActualDemand(nw, h, dqdh);
                node->qGrad += dqdh;
                xQ[i] -= q;
            }
            node->actualDemand = q;
            node->outflow += q;
        }

        // ... for tanks and reservoirs all flow excess becomes outflow

        else
        {
            node->outflow = xQ[i];
            xQ[i] = 0.0;
        }
    }
}